

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

int archive_write_set_format_ar_svr4(archive *_a)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_ar_svr4");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    iVar2 = archive_write_set_format_ar((archive_write *)_a);
    if (iVar2 == 0) {
      _a->archive_format = 0x70001;
      _a->archive_format_name = "ar (GNU/SVR4)";
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_set_format_ar_svr4(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_ar_svr4");
	r = archive_write_set_format_ar(a);
	if (r == ARCHIVE_OK) {
		a->archive.archive_format = ARCHIVE_FORMAT_AR_GNU;
		a->archive.archive_format_name = "ar (GNU/SVR4)";
	}
	return (r);
}